

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Rep *pRVar7;
  long lVar8;
  FileDescriptor *in_RAX;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar10;
  int *piVar11;
  DescriptorProto *pDVar12;
  EnumDescriptorProto *pEVar13;
  ServiceDescriptorProto *pSVar14;
  FieldDescriptorProto *pFVar15;
  FileOptions *pFVar16;
  undefined8 *puVar17;
  int tmp;
  Arena *arena;
  long lVar18;
  long lVar19;
  FileDescriptor *local_38;
  
  uVar5 = *(undefined8 *)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar6 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar17 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
  if ((uVar6 & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  local_38 = in_RAX;
  internal::ArenaStringPtr::Set(&proto->name_,uVar5,puVar17);
  lVar18 = *(long *)(this + 8);
  if (*(long *)(lVar18 + 8) != 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    uVar6 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar17 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      puVar17 = (undefined8 *)*puVar17;
    }
    internal::ArenaStringPtr::Set(&proto->package_,lVar18,puVar17);
  }
  if (this[0x3a] == (FileDescriptor)0x3) {
    pcVar9 = SyntaxName(SYNTAX_PROTO3);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    uVar6 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar17 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      puVar17 = (undefined8 *)*puVar17;
    }
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->syntax_,pcVar9,puVar17);
  }
  if (0 < *(int *)(this + 0x20)) {
    lVar18 = 0;
    do {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_38 = this;
        std::
        call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                  (*(once_flag **)(this + 0x18),DependenciesOnceInit,&local_38);
      }
      pRVar7 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_0034ebed:
        obj = Arena::Create<std::__cxx11::string>
                        ((proto->dependency_).super_RepeatedPtrFieldBase.arena_);
        psVar10 = (string *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->dependency_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar2 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar2) goto LAB_0034ebed;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        psVar10 = (string *)pRVar7->elements[iVar2];
      }
      std::__cxx11::string::_M_assign(psVar10);
      lVar18 = lVar18 + 1;
    } while (lVar18 < *(int *)(this + 0x20));
  }
  if (0 < *(int *)(this + 0x24)) {
    pRVar1 = &proto->public_dependency_;
    lVar18 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x48) + lVar18 * 4);
      uVar3 = (proto->public_dependency_).current_size_;
      uVar4 = (proto->public_dependency_).total_size_;
      if (uVar3 == uVar4) {
        RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
      }
      piVar11 = RepeatedField<int>::elements(pRVar1);
      piVar11[uVar3] = iVar2;
      pRVar1->current_size_ = uVar3 + 1;
      lVar18 = lVar18 + 1;
    } while (lVar18 < *(int *)(this + 0x24));
  }
  if (0 < *(int *)(this + 0x28)) {
    pRVar1 = &proto->weak_dependency_;
    lVar18 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x50) + lVar18 * 4);
      uVar3 = (proto->weak_dependency_).current_size_;
      uVar4 = (proto->weak_dependency_).total_size_;
      if (uVar3 == uVar4) {
        RepeatedField<int>::Reserve(pRVar1,uVar4 + 1);
      }
      piVar11 = RepeatedField<int>::elements(pRVar1);
      piVar11[uVar3] = iVar2;
      pRVar1->current_size_ = uVar3 + 1;
      lVar18 = lVar18 + 1;
    } while (lVar18 < *(int *)(this + 0x28));
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      lVar8 = *(long *)(this + 0x58);
      pRVar7 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_0034ecf4:
        pDVar12 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                            ((proto->message_type_).super_RepeatedPtrFieldBase.arena_);
        pDVar12 = (DescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,pDVar12);
      }
      else {
        iVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar2) goto LAB_0034ecf4;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pDVar12 = (DescriptorProto *)pRVar7->elements[iVar2];
      }
      Descriptor::CopyTo((Descriptor *)(lVar8 + lVar19),pDVar12);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x88;
    } while (lVar18 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x30)) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      lVar8 = *(long *)(this + 0x60);
      pRVar7 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_0034ed5a:
        pEVar13 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                            ((proto->enum_type_).super_RepeatedPtrFieldBase.arena_);
        pEVar13 = (EnumDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->enum_type_).super_RepeatedPtrFieldBase,pEVar13);
      }
      else {
        iVar2 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar2) goto LAB_0034ed5a;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pEVar13 = (EnumDescriptorProto *)pRVar7->elements[iVar2];
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar8 + lVar19),pEVar13);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x48;
    } while (lVar18 < *(int *)(this + 0x30));
  }
  if (0 < *(int *)(this + 0x34)) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      lVar8 = *(long *)(this + 0x68);
      pRVar7 = (proto->service_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_0034edbd:
        pSVar14 = Arena::CreateMaybeMessage<google::protobuf::ServiceDescriptorProto>
                            ((proto->service_).super_RepeatedPtrFieldBase.arena_);
        pSVar14 = (ServiceDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->service_).super_RepeatedPtrFieldBase,pSVar14);
      }
      else {
        iVar2 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar2) goto LAB_0034edbd;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pSVar14 = (ServiceDescriptorProto *)pRVar7->elements[iVar2];
      }
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar8 + lVar19),pSVar14);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x30;
    } while (lVar18 < *(int *)(this + 0x34));
  }
  if (0 < *(int *)(this + 0x3c)) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      lVar8 = *(long *)(this + 0x70);
      pRVar7 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_0034ee29:
        pFVar15 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                            ((proto->extension_).super_RepeatedPtrFieldBase.arena_);
        pFVar15 = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->extension_).super_RepeatedPtrFieldBase,pFVar15);
      }
      else {
        iVar2 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar2) goto LAB_0034ee29;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pFVar15 = (FieldDescriptorProto *)pRVar7->elements[iVar2];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar8 + lVar19),pFVar15);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x48;
    } while (lVar18 < *(int *)(this + 0x3c));
  }
  if (*(undefined1 **)(this + 0x78) != _FileOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    if (proto->options_ == (FileOptions *)0x0) {
      uVar6 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pFVar16 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(arena);
      proto->options_ = pFVar16;
    }
    FileOptions::CopyFrom(proto->options_,*(FileOptions **)(this + 0x78));
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}